

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O3

uint32_t aom_sse_odd_size(uint8_t *a,int a_stride,uint8_t *b,int b_stride,int w,int h)

{
  uint32_t uVar1;
  ulong uVar2;
  int iVar3;
  
  if (0 < h) {
    uVar1 = 0;
    iVar3 = 0;
    do {
      if (0 < w) {
        uVar2 = 0;
        do {
          uVar1 = uVar1 + ((uint)a[uVar2] - (uint)b[uVar2]) * ((uint)a[uVar2] - (uint)b[uVar2]);
          uVar2 = uVar2 + 1;
        } while ((uint)w != uVar2);
      }
      a = a + a_stride;
      b = b + b_stride;
      iVar3 = iVar3 + 1;
    } while (iVar3 != h);
    return uVar1;
  }
  return 0;
}

Assistant:

static void variance(const uint8_t *a, int a_stride, const uint8_t *b,
                     int b_stride, int w, int h, uint32_t *sse, int *sum) {
  int i, j;
  int tsum = 0;
  uint32_t tsse = 0;

  for (i = 0; i < h; ++i) {
    for (j = 0; j < w; ++j) {
      const int diff = a[j] - b[j];
      tsum += diff;
      tsse += diff * diff;
    }

    a += a_stride;
    b += b_stride;
  }
  *sum = tsum;
  *sse = tsse;
}